

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O2

bool dlib::file_exists(string *filename)

{
  file temp;
  data local_50;
  
  file::file((file *)&local_50,filename);
  file::data::~data(&local_50);
  return true;
}

Assistant:

bool file_exists (
        const std::string& filename
    )
    {
        try
        {
            dlib::file temp(filename);
            return true;
        }
        catch (file::file_not_found&)
        {
            return false;
        }
    }